

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

bool __thiscall tcu::CasePaths::matches(CasePaths *this,string *caseName,bool allowPrefix)

{
  pointer pbVar1;
  const_iterator pathStart;
  size_type sVar2;
  const_iterator cVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  size_type *psVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  de::splitString(&local_48,caseName,'.');
  pbVar1 = (this->m_casePatterns).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->m_casePatterns).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  bVar10 = lVar8 != 0;
  if (bVar10) {
    uVar9 = lVar8 >> 5;
    pathStart._M_current = (caseName->_M_dataplus)._M_p;
    sVar2 = caseName->_M_string_length;
    cVar3._M_current = (pbVar1->_M_dataplus)._M_p;
    bVar5 = matchWildcards(cVar3,(const_iterator)(cVar3._M_current + pbVar1->_M_string_length),
                           pathStart,(const_iterator)(pathStart._M_current + sVar2),allowPrefix);
    if (!bVar5) {
      psVar7 = &pbVar1[1]._M_string_length;
      uVar4 = 1;
      do {
        uVar6 = uVar4;
        if (uVar9 + (uVar9 == 0) == uVar6) break;
        cVar3._M_current =
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar7 + -1))->
             _M_dataplus)._M_p;
        bVar10 = matchWildcards(cVar3,(const_iterator)(cVar3._M_current + *psVar7),pathStart,
                                (const_iterator)(pathStart._M_current + sVar2),allowPrefix);
        psVar7 = psVar7 + 4;
        uVar4 = uVar6 + 1;
      } while (!bVar10);
      bVar10 = uVar6 < uVar9;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar10;
}

Assistant:

bool CasePaths::matches (const string& caseName, bool allowPrefix) const
{
	const vector<string> components = de::splitString(caseName, '.');

	for (size_t ndx = 0; ndx < m_casePatterns.size(); ++ndx)
	{
#if defined(TCU_HIERARCHICAL_CASEPATHS)
		const vector<string> patternComponents = de::splitString(m_casePatterns[ndx], '.');

		if (patternMatches(patternComponents.begin(), patternComponents.end(),
						   components.begin(), components.end(), allowPrefix))
			return true;
#else
		if (matchWildcards(m_casePatterns[ndx].begin(), m_casePatterns[ndx].end(),
						   caseName.begin(), caseName.end(), allowPrefix))
			return true;
#endif
	}

	return false;
}